

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

bool __thiscall Moc::testFunctionRevision(Moc *this,FunctionDef *def)

{
  bool bVar1;
  QTypeRevision QVar2;
  
  bVar1 = Parser::test(&this->super_Parser,Q_REVISION_TOKEN);
  if (bVar1) {
    QVar2 = parseRevision(this);
    def->revision = (uint)(ushort)QVar2;
  }
  return bVar1;
}

Assistant:

bool Moc::testFunctionRevision(FunctionDef *def)
{

    if (test(Q_REVISION_TOKEN)) {
        def->revision = parseRevision().toEncodedVersion<int>();
        return true;
    }

    return false;
}